

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O3

QBitArray * performBitwiseOperationInPlace<std::bit_xor<unsigned_char>>(QBitArray *self,long other)

{
  char *pcVar1;
  long size;
  QBitArray *pQVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  
  pcVar5 = (self->d).d.ptr;
  lVar4 = (self->d).d.size;
  pcVar1 = pcVar5;
  if (pcVar5 == (char *)0x0) {
    pcVar1 = &QByteArray::_empty;
  }
  pcVar3 = *(char **)(other + 8);
  lVar7 = *(long *)(other + 0x10);
  pcVar6 = &QByteArray::_empty;
  if (pcVar3 != (char *)0x0) {
    pcVar6 = pcVar3;
  }
  size = lVar7 * 8 - (long)*pcVar6;
  if (lVar4 * 8 - (long)*pcVar1 < size) {
    QBitArray::resize(self,size);
    pcVar5 = (self->d).d.ptr;
    lVar4 = (self->d).d.size;
    pcVar3 = *(char **)(other + 8);
    lVar7 = *(long *)(other + 0x10);
  }
  pQVar2 = performBitwiseOperationHelper<std::bit_xor<unsigned_char>>
                     (self,pcVar5,lVar4,pcVar3,lVar7);
  return pQVar2;
}

Assistant:

Q_NEVER_INLINE static
QBitArray &performBitwiseOperationInPlace(QBitArray &self, const QBitArray &other, BitwiseOp op)
{
    if (self.size() < other.size())
        self.resize(other.size());
    return performBitwiseOperationHelper(self, self, other, op);
}